

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O1

AssertionKind slang::ast::SemanticFacts::getAssertKind(SyntaxKind kind)

{
  AssertionKind AVar1;
  
  AVar1 = Assert;
  if ((int)kind < 0xc1) {
    if (0x6a < (int)kind) {
      if (kind == CoverPropertyStatement) {
        return CoverProperty;
      }
      return CoverSequence;
    }
    if (kind != AssertPropertyStatement) {
      return Assume;
    }
  }
  else if ((int)kind < 0xef) {
    if (kind == ExpectPropertyStatement) {
      return Expect;
    }
  }
  else {
    if (kind != RestrictPropertyStatement) {
      if (kind == ImmediateCoverStatement) {
        return CoverProperty;
      }
      return Assume;
    }
    AVar1 = Restrict;
  }
  return AVar1;
}

Assistant:

AssertionKind SemanticFacts::getAssertKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ImmediateAssertStatement: return AssertionKind::Assert;
        case SyntaxKind::ImmediateAssumeStatement: return AssertionKind::Assume;
        case SyntaxKind::ImmediateCoverStatement: return AssertionKind::CoverProperty;
        case SyntaxKind::AssertPropertyStatement: return AssertionKind::Assert;
        case SyntaxKind::AssumePropertyStatement: return AssertionKind::Assume;
        case SyntaxKind::CoverPropertyStatement: return AssertionKind::CoverProperty;
        case SyntaxKind::CoverSequenceStatement: return AssertionKind::CoverSequence;
        case SyntaxKind::ExpectPropertyStatement: return AssertionKind::Expect;
        case SyntaxKind::RestrictPropertyStatement: return AssertionKind::Restrict;
        default: SLANG_UNREACHABLE;
    }
}